

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
               (TestContext *testCtx,RenderContext *renderCtx,CaseFactories *cases,
               vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *shaderTypes,
               TestCaseGroup *dstGroup)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  TestNode *node;
  ulong uVar4;
  void *local_118;
  long local_110;
  long local_108;
  RenderContext *local_100;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *local_f8;
  PrecisionTestContext ctx;
  FloatFormat lowp;
  FloatFormat mediump;
  FloatFormat highp;
  
  local_100 = renderCtx;
  local_f8 = shaderTypes;
  iVar3 = tcu::CommandLine::getTestIterationCount(testCtx->m_cmdLine);
  ctx.numRandoms = 0x4000;
  if (0 < iVar3) {
    ctx.numRandoms = iVar3;
  }
  tcu::FloatFormat::FloatFormat(&highp,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  uVar4 = 0;
  tcu::FloatFormat::FloatFormat(&mediump,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(&lowp,0,0,7,false,YES,MAYBE,MAYBE);
  ctx.renderCtx = local_100;
  ctx.testCtx = testCtx;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::vector(&ctx.shaderTypes,local_f8);
  ctx.formats[2] = &highp;
  ctx.formats[1] = &mediump;
  ctx.formats[0] = &lowp;
  while( true ) {
    (*cases->_vptr_CaseFactories[2])(&local_118,cases);
    lVar2 = local_110;
    pvVar1 = local_118;
    if (local_118 != (void *)0x0) {
      operator_delete(local_118,local_108 - (long)local_118);
    }
    if ((ulong)(lVar2 - (long)pvVar1 >> 3) <= uVar4) break;
    (*cases->_vptr_CaseFactories[2])(&local_118,cases);
    node = &createFuncGroup(&ctx,*(CaseFactory **)((long)local_118 + uVar4 * 8))->super_TestNode;
    tcu::TestNode::addChild(&dstGroup->super_TestNode,node);
    if (local_118 != (void *)0x0) {
      operator_delete(local_118,local_108 - (long)local_118);
    }
    uVar4 = uVar4 + 1;
  }
  if (ctx.shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ctx.shaderTypes.
                    super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ctx.shaderTypes.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ctx.shaderTypes.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addBuiltinPrecisionTests (TestContext&					testCtx,
							   RenderContext&				renderCtx,
							   const CaseFactories&			cases,
							   const vector<ShaderType>&	shaderTypes,
							   TestCaseGroup&				dstGroup)
{
	const int						userRandoms	= testCtx.getCommandLine().getTestIterationCount();
	const int						defRandoms	= 16384;
	const int						numRandoms	= userRandoms > 0 ? userRandoms : defRandoms;
	const FloatFormat				highp		(-126, 127, 23, true,
												 tcu::MAYBE,	// subnormals
												 tcu::YES,		// infinities
												 tcu::MAYBE);	// NaN
	// \todo [2014-04-01 lauri] Check these once Khronos bug 11840 is resolved.
	const FloatFormat				mediump		(-13, 13, 9, false);
	// A fixed-point format is just a floating point format with a fixed
	// exponent and support for subnormals.
	const FloatFormat				lowp		(0, 0, 7, false, tcu::YES);
	const PrecisionTestContext		ctx			(testCtx, renderCtx, highp, mediump, lowp,
												 shaderTypes, numRandoms);

	for (size_t ndx = 0; ndx < cases.getFactories().size(); ++ndx)
		dstGroup.addChild(createFuncGroup(ctx, *cases.getFactories()[ndx]));
}